

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BaseDictionary.h
# Opt level: O1

int __thiscall
JsUtil::
BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
::
Insert<(JsUtil::BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>::InsertOperations)0>
          (BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<int>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
           *this,JavascriptString **key,SimpleDictionaryPropertyDescriptor<int> *value)

{
  Type *pTVar1;
  SimpleDictionaryPropertyDescriptor<int> *pSVar2;
  SimpleDictionaryPropertyDescriptor<int> SVar3;
  int *piVar4;
  Entry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
  *pEVar5;
  code *pcVar6;
  char cVar7;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *pBVar8;
  bool bVar9;
  hash_t hashCode;
  int iVar10;
  undefined4 *puVar11;
  long lVar12;
  ulong uVar13;
  uint uVar14;
  CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<int>,JsUtil::(anonymous_namespace)::KeyValueEntry>
  *this_00;
  SimpleDictionaryPropertyDescriptor<int> *addr;
  uint uVar15;
  SimpleDictionaryPropertyDescriptor<int> local_68;
  SimpleDictionaryPropertyDescriptor<int> *local_60;
  ulong local_58;
  long local_50;
  Entry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
  *local_48;
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *local_40;
  uint local_34;
  
  lVar12 = *(long *)this;
  local_60 = value;
  if (lVar12 == 0) {
    BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
    ::Initialize((BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                  *)this,0);
    lVar12 = *(long *)this;
  }
  hashCode = GetHashCodeWithKey<Js::JavascriptString*>(key);
  local_34 = BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
             ::GetBucket(hashCode,*(int *)(this + 0x1c),*(int *)(this + 0x2c));
  uVar14 = *(uint *)(lVar12 + (ulong)local_34 * 4);
  local_40 = (BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
              *)this;
  if ((int)uVar14 < 0) {
    cVar7 = (char)(uVar14 >> 0x18);
    uVar15 = 0;
  }
  else {
    lVar12 = *(long *)(this + 8);
    uVar15 = 0;
    do {
      this_00 = (CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<int>,JsUtil::(anonymous_namespace)::KeyValueEntry>
                 *)((ulong)uVar14 * 0x20 + lVar12);
      bVar9 = CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,Js::SimpleDictionaryPropertyDescriptor<int>,JsUtil::(anonymous_namespace)::KeyValueEntry>
              ::
              KeyEquals<Js::PropertyRecordStringHashComparer<Js::JavascriptString*>,Js::JavascriptString*>
                        (this_00,key,hashCode);
      if (bVar9) {
        if (local_40->stats != (DictionaryStats *)0x0) {
          DictionaryStats::Lookup(local_40->stats,uVar15);
        }
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3b2,"(op != Insert_Add)","op != Insert_Add");
        if (bVar9) {
          *puVar11 = 0;
          return -1;
        }
        goto LAB_00e3bb05;
      }
      uVar15 = uVar15 + 1;
      uVar14 = *(uint *)(this_00 + 8);
    } while (-1 < (int)uVar14);
    cVar7 = (char)(uVar14 >> 0x18);
  }
  if (local_40->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(local_40->stats,uVar15);
  }
  pBVar8 = local_40;
  iVar10 = -1;
  if (cVar7 < '\0') {
    if (local_40->freeCount == 0) {
      uVar14 = local_40->count;
      if (uVar14 == local_40->size) {
        BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
        ::Resize(local_40);
        local_34 = BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                   ::GetBucket(hashCode,pBVar8->bucketCount,pBVar8->modFunctionIndex);
        uVar14 = pBVar8->count;
      }
      uVar13 = (ulong)uVar14;
      pBVar8->count = uVar14 + 1;
      if (pBVar8->size < (int)(uVar14 + 1)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f1,"(count <= size)","count <= size");
        if (!bVar9) goto LAB_00e3bb05;
        *puVar11 = 0;
      }
      if (pBVar8->size <= (int)uVar14) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3f2,"(index < size)","index < size");
        if (!bVar9) goto LAB_00e3bb05;
        *puVar11 = 0;
      }
    }
    else {
      if (local_40->freeCount < 1) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d4,"(freeCount > 0)","freeCount > 0");
        if (!bVar9) goto LAB_00e3bb05;
        *puVar11 = 0;
      }
      if (pBVar8->freeList < 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d5,"(freeList >= 0)","freeList >= 0");
        if (!bVar9) goto LAB_00e3bb05;
        *puVar11 = 0;
      }
      if (pBVar8->count <= pBVar8->freeList) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar11 = 1;
        bVar9 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BaseDictionary.h"
                           ,0x3d6,"(freeList < count)","freeList < count");
        if (!bVar9) {
LAB_00e3bb05:
          pcVar6 = (code *)invalidInstructionException();
          (*pcVar6)();
        }
        *puVar11 = 0;
      }
      uVar13 = (ulong)(uint)pBVar8->freeList;
      pTVar1 = &pBVar8->freeCount;
      *pTVar1 = *pTVar1 + -1;
      if (*pTVar1 != 0) {
        iVar10 = BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<int>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
                 ::GetNextFreeEntryIndex((pBVar8->entries).ptr + pBVar8->freeList);
        pBVar8->freeList = iVar10;
      }
    }
    local_48 = (pBVar8->entries).ptr;
    lVar12 = (long)(int)uVar13;
    SVar3 = (SimpleDictionaryPropertyDescriptor<int>)*key;
    local_58 = uVar13;
    local_50 = lVar12;
    Memory::Recycler::WBSetBit((char *)&local_68);
    local_68 = SVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_68);
    SVar3 = local_68;
    pSVar2 = (SimpleDictionaryPropertyDescriptor<int> *)(local_48 + lVar12);
    addr = pSVar2 + 2;
    *pSVar2 = *local_60;
    Memory::Recycler::WBSetBit((char *)addr);
    *addr = SVar3;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(addr);
    *(hash_t *)(pSVar2 + 3) = hashCode;
    piVar4 = (pBVar8->buckets).ptr;
    pEVar5 = (pBVar8->entries).ptr;
    iVar10 = (int)local_58;
    pEVar5[lVar12].
    super_DictionaryEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
    .
    super_CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
    .
    super_KeyValueEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
    .
    super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<int>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>_>
    .
    super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
    .next = piVar4[local_34];
    piVar4[local_34] = (int)local_50;
    uVar15 = 0;
    uVar13 = local_58 & 0xffffffff;
    do {
      uVar14 = pEVar5[(int)uVar13].
               super_DictionaryEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
               .
               super_CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
               .
               super_KeyValueEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
               .
               super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<int>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>_>
               .
               super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<int>_>
               .next;
      uVar13 = (ulong)uVar14;
      uVar15 = uVar15 + 1;
    } while (uVar14 != 0xffffffff);
    if (pBVar8->stats != (DictionaryStats *)0x0) {
      DictionaryStats::Insert(pBVar8->stats,uVar15);
    }
  }
  return iVar10;
}

Assistant:

int Insert(const TKey& key, const TValue& value)
        {
            int * localBuckets = buckets;
            if (localBuckets == nullptr)
            {
                Initialize(0);
                localBuckets = buckets;
            }

#if DBG || PROFILE_DICTIONARY
            // Always search and verify
            const bool needSearch = true;
#else
            const bool needSearch = (op != Insert_Add);
#endif
            hash_t hashCode = GetHashCode(key);
            uint targetBucket = this->GetBucket(hashCode);
            if (needSearch)
            {
#if PROFILE_DICTIONARY
                uint depth = 0;
#endif
                EntryType * localEntries = entries;
                for (int i = localBuckets[targetBucket]; i >= 0; i = localEntries[i].next)
                {
                    if (localEntries[i].template KeyEquals<Comparer<TKey>>(key, hashCode))
                    {
#if PROFILE_DICTIONARY
                        if (stats)
                            stats->Lookup(depth);
#endif
                        Assert(op != Insert_Add);
                        if (op == Insert_Item)
                        {
                            localEntries[i].SetValue(value);
                            return i;
                        }
                        return -1;
                    }
#if PROFILE_DICTIONARY
                    depth += 1;
#endif
                }

#if PROFILE_DICTIONARY
                if (stats)
                    stats->Lookup(depth);
#endif
            }

            // Ideally we'd do cleanup only if weak references have been collected since the last resize
            // but that would require us to use an additional field to store the last recycler cleanup id
            // that we saw
            // We can add that optimization later if we have to.
            if (EntryType::SupportsCleanup() && freeCount == 0 && count == size)
            {
                this->MapAndRemoveIf([](EntryType& entry)
                {
                    return EntryType::NeedsCleanup(entry);
                });
            }

            int index;
            if (freeCount != 0)
            {
                Assert(freeCount > 0);
                Assert(freeList >= 0);
                Assert(freeList < count);
                index = freeList;
                freeCount--;
                if(freeCount != 0)
                {
                    freeList = GetNextFreeEntryIndex(entries[index]);
                }
            }
            else
            {
                // If there's nothing free, then in general, we set index to count, and increment count
                // If we resize, we also need to recalculate the target
                // However, if cleanup is supported, then before resize, we should try and clean up and see
                // if something got freed, and if it did, reuse that index
                if (count == size)
                {
                    Resize();
                    targetBucket = this->GetBucket(hashCode);
                    index = count;
                    count++;
                }
                else
                {
                    index = count;
                    count++;
                }

                Assert(count <= size);
                Assert(index < size);
            }

            entries[index].Set(key, value, hashCode);
            entries[index].next = buckets[targetBucket];
            buckets[targetBucket] = index;

#if PROFILE_DICTIONARY
            int profileIndex = index;
            uint depth = 1;  // need to recalculate depth in case there was a resize (also 1-based for stats->Insert)
            while(entries[profileIndex].next != -1)
            {
                profileIndex = entries[profileIndex].next;
                ++depth;
            }
            if (stats)
                stats->Insert(depth);
#endif
            return index;
        }